

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_CommitInt_Test::~Transaction_CommitInt_Test(Transaction_CommitInt_Test *this)

{
  (this->super_Transaction).super_Test._vptr_Test = (_func_int **)&PTR__Transaction_00277410;
  (this->super_Transaction).db_.super_database._vptr_database =
       (_func_int **)&PTR__mock_database_00277450;
  testing::internal::FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::~FunctionMocker
            (&(this->super_Transaction).db_.gmock02_allocate_52);
  testing::internal::
  FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  ~FunctionMocker(&(this->super_Transaction).db_.gmock14_get_51);
  pstore::database::~database(&(this->super_Transaction).db_.super_database);
  in_memory_store::~in_memory_store(&(this->super_Transaction).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, CommitInt) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto header = this->get_header ();
    std::uint64_t const r0footer_offset = header->footer_pos.load ().absolute ();

    int const data_value = 32749;

    // Scope for the single transaction that we'll commit for the test.
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        {
            // Write an integer to the store.
            // If rw is a spanning pointer, it will only be saved to the store when it is deleted.
            // TODO: write a large vector (>4K) so the 'protect' function, which is called by the
            // transaction commit function, has an effect.
            std::pair<std::shared_ptr<int>, pstore::typed_address<int>> rw =
                transaction.alloc_rw<int> ();
            ASSERT_EQ (0U, rw.second.absolute () % alignof (int))
                << "The address must be suitably aligned for int";
            *(rw.first) = data_value;
        }

        transaction.commit ();
    }

    std::uint64_t new_header_offset = pstore::leader_size;
    new_header_offset += sizeof (pstore::trailer);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (int));
    std::uint64_t const r1contents_offset = new_header_offset;
    new_header_offset += sizeof (int);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (pstore::trailer));

    std::uint64_t const g1footer_offset = header->footer_pos.load ().absolute ();
    ASSERT_EQ (new_header_offset, g1footer_offset)
        << "Expected offset of r1 footer to be " << new_header_offset;


    // Header checks.
    EXPECT_THAT (pstore::header::file_signature1, ::testing::ContainerEq (header->a.signature1))
        << "File header was missing";
    EXPECT_EQ (g1footer_offset, header->footer_pos.load ().absolute ());

    // Check the two footers.
    {
        auto r0footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + r0footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0footer->a.signature1))
            << "Did not find the r0 footer signature1";
        EXPECT_EQ (0U, r0footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0footer->signature2))
            << "Did not find r0 footer signature2";

        auto r1footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + g1footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1footer->a.signature1))
            << "Did not find the r1 footer signature1";
        EXPECT_EQ (1U, r1footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_GE (r1footer->a.size, sizeof (int)) << "r1 footer size must be at least sizeof (int";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (pstore::leader_size),
                   r1footer->a.prev_generation)
            << "r1 previous pointer must point to r0 footer";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1footer->signature2))
            << "Did not find r1 footer signature2";

        EXPECT_GE (r1footer->a.time, r0footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }

    // Finally check the r1 contents
    {
        auto r1data = reinterpret_cast<int const *> (store_.buffer ().get () + r1contents_offset);
        EXPECT_EQ (data_value, *r1data);
    }
}